

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_atomic_ptr_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *expr_type;
  string local_50;
  undefined1 local_1d;
  uint32_t local_1c;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_1d = 0;
  local_1c = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  to_non_uniform_aware_expression_abi_cxx11_(__return_storage_ptr__,this,id);
  bVar1 = should_dereference(this,local_1c);
  if (bVar1) {
    expr_type = Compiler::expression_type(&this->super_Compiler,local_1c);
    dereference_expression(&local_50,this,expr_type,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_atomic_ptr_expression(uint32_t id)
{
	string expr = to_non_uniform_aware_expression(id);
	// If we have naked pointer to POD, we need to dereference to get the proper ".value" resolve.
	if (should_dereference(id))
		expr = dereference_expression(expression_type(id), expr);
	return expr;
}